

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestPhonySelfReferenceKept::Run(ParserTestPhonySelfReferenceKept *this)

{
  State *state;
  Edge *pEVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  StringPiece path;
  allocator<char> local_d9;
  string err;
  string local_b8;
  char kInput [18];
  ManifestParser parser;
  
  builtin_strncpy(kInput,"build a: phony a\n",0x12);
  state = &(this->super_ParserTest).state;
  ManifestParser::ManifestParser
            (&parser,state,(FileReader *)&(this->super_ParserTest).fs_,
             (ManifestParserOptions)0x100000000);
  pTVar2 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,kInput,&local_d9);
  bVar3 = ManifestParser::ParseTest(&parser,&local_b8,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x196,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_b8);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x197,"\"\" == err");
  path.len_ = 1;
  path.str_ = "a";
  pNVar4 = State::LookupNode(state,path);
  pEVar1 = pNVar4->in_edge_;
  bVar3 = testing::Test::Check
                    (g_current_test,
                     (long)(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start == 8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                     ,0x19b,"edge->inputs_.size() == 1");
  if ((!bVar3) ||
     (bVar3 = testing::Test::Check
                        (g_current_test,
                         *(pEVar1->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start == pNVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                         ,0x19c,"edge->inputs_[0] == node"), !bVar3)) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceKept) {
  const char kInput[] =
"build a: phony a\n";
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  ManifestParser parser(&state, &fs_, parser_opts);
  string err;
  EXPECT_TRUE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("", err);

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_EQ(edge->inputs_.size(), 1);
  ASSERT_EQ(edge->inputs_[0], node);
}